

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbnf.cpp
# Opt level: O0

int32_t __thiscall
icu_63::RuleBasedNumberFormat::getNumberOfRuleSetNames(RuleBasedNumberFormat *this)

{
  UBool UVar1;
  NFRuleSet **local_20;
  NFRuleSet **p;
  int32_t result;
  RuleBasedNumberFormat *this_local;
  
  p._4_4_ = 0;
  if (this->localizations == (LocalizationInfo *)0x0) {
    if (this->fRuleSets != (NFRuleSet **)0x0) {
      for (local_20 = this->fRuleSets; *local_20 != (NFRuleSet *)0x0; local_20 = local_20 + 1) {
        UVar1 = NFRuleSet::isPublic(*local_20);
        if (UVar1 != '\0') {
          p._4_4_ = p._4_4_ + 1;
        }
      }
    }
  }
  else {
    p._4_4_ = (*this->localizations->_vptr_LocalizationInfo[3])();
  }
  return p._4_4_;
}

Assistant:

int32_t
RuleBasedNumberFormat::getNumberOfRuleSetNames() const
{
    int32_t result = 0;
    if (localizations) {
        result = localizations->getNumberOfRuleSets();
    }
    else if (fRuleSets) {
        for (NFRuleSet** p = fRuleSets; *p; ++p) {
            if ((**p).isPublic()) {
                ++result;
            }
        }
    }
    return result;
}